

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int encode_session_identifier
              (ptls_context_t *ctx,ptls_buffer_t *buf,uint32_t ticket_age_add,
              ptls_iovec_t ticket_nonce,ptls_key_schedule_t *sched,char *server_name,
              uint16_t key_exchange_id,uint16_t csid,char *negotiated_protocol)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ptls_iovec_t nonce;
  int iVar4;
  ptls_key_schedule_t *in_RSI;
  long in_RDI;
  long in_R9;
  char *in_stack_00000008;
  char *in_stack_00000020;
  size_t body_size;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  uint32_t _v_3;
  uint16_t _v_2;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint64_t _v;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t in_stack_fffffffffffffee8;
  ptls_key_schedule_t *ppVar5;
  void *in_stack_fffffffffffffef0;
  ptls_buffer_t *in_stack_fffffffffffffef8;
  ptls_buffer_t *buf_00;
  uint8_t *secret;
  ptls_key_schedule_t *sched_00;
  uint8_t *puVar6;
  long local_a0;
  long local_88;
  long local_60;
  long local_40;
  int local_34;
  
  local_40 = 2;
  puVar6 = (uint8_t *)0x2;
  ppVar5 = in_RSI;
  local_34 = ptls_buffer__do_pushv
                       (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8);
  if (local_34 == 0) {
    lVar1 = *(long *)in_RSI->secret;
    local_34 = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8);
    if (local_34 == 0) {
      (*(code *)**(undefined8 **)(in_RDI + 8))(*(undefined8 *)(in_RDI + 8));
      local_34 = ptls_buffer__do_pushv
                           (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8);
      if (local_34 == 0) {
        local_60 = 2;
        secret = (uint8_t *)0x2;
        sched_00 = in_RSI;
        local_34 = ptls_buffer__do_pushv
                             (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              in_stack_fffffffffffffee8);
        if (local_34 == 0) {
          lVar2 = *(long *)in_RSI->secret;
          local_34 = ptls_buffer_reserve(in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
                                        );
          if ((local_34 == 0) &&
             (nonce.len = (size_t)ppVar5, nonce.base = puVar6,
             local_34 = derive_resumption_secret(sched_00,secret,nonce), local_34 == 0)) {
            *(long *)in_RSI->secret =
                 *(long *)(*(long *)(in_R9 + 0x58) + 8) + *(long *)in_RSI->secret;
            lVar3 = *(long *)in_RSI->secret;
            for (; local_60 != 0; local_60 = local_60 + -1) {
              *(char *)(*(long *)in_RSI + (lVar2 - local_60)) =
                   (char)((ulong)(lVar3 - lVar2) >> (((char)local_60 + -1) * '\b' & 0x3fU));
            }
            local_34 = ptls_buffer__do_pushv
                                 (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                  in_stack_fffffffffffffee8);
            if (((local_34 == 0) &&
                (local_34 = ptls_buffer__do_pushv
                                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                       in_stack_fffffffffffffee8), local_34 == 0)) &&
               (local_34 = ptls_buffer__do_pushv
                                     (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                      in_stack_fffffffffffffee8), local_34 == 0)) {
              local_88 = 2;
              local_34 = ptls_buffer__do_pushv
                                   (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                    in_stack_fffffffffffffee8);
              if (local_34 == 0) {
                lVar2 = *(long *)in_RSI->secret;
                if (in_stack_00000008 != (char *)0x0) {
                  strlen(in_stack_00000008);
                  iVar4 = ptls_buffer__do_pushv
                                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                                     in_stack_fffffffffffffee8);
                  if (iVar4 != 0) {
                    return iVar4;
                  }
                }
                lVar3 = *(long *)in_RSI->secret;
                for (; local_88 != 0; local_88 = local_88 + -1) {
                  *(char *)(*(long *)in_RSI + (lVar2 - local_88)) =
                       (char)((ulong)(lVar3 - lVar2) >> (((char)local_88 + -1) * '\b' & 0x3fU));
                }
                local_a0 = 1;
                buf_00 = (ptls_buffer_t *)0x1;
                local_34 = ptls_buffer__do_pushv
                                     ((ptls_buffer_t *)0x1,in_stack_fffffffffffffef0,
                                      in_stack_fffffffffffffee8);
                if (local_34 == 0) {
                  lVar2 = *(long *)in_RSI->secret;
                  if (in_stack_00000020 != (char *)0x0) {
                    ppVar5 = in_RSI;
                    strlen(in_stack_00000020);
                    local_34 = ptls_buffer__do_pushv(buf_00,in_stack_00000020,(size_t)ppVar5);
                    if (local_34 != 0) {
                      return local_34;
                    }
                  }
                  lVar3 = *(long *)in_RSI->secret;
                  for (; local_a0 != 0; local_a0 = local_a0 + -1) {
                    *(char *)(*(long *)in_RSI + (lVar2 - local_a0)) =
                         (char)((ulong)(lVar3 - lVar2) >> (((char)local_a0 + -1) * '\b' & 0x3fU));
                  }
                  lVar2 = *(long *)in_RSI->secret;
                  for (; local_40 != 0; local_40 = local_40 + -1) {
                    *(char *)(*(long *)in_RSI + (lVar1 - local_40)) =
                         (char)((ulong)(lVar2 - lVar1) >> (((char)local_40 + -1) * '\b' & 0x3fU));
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

static int encode_session_identifier(ptls_context_t *ctx, ptls_buffer_t *buf, uint32_t ticket_age_add, ptls_iovec_t ticket_nonce,
                                     ptls_key_schedule_t *sched, const char *server_name, uint16_t key_exchange_id, uint16_t csid,
                                     const char *negotiated_protocol)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* format id */
        ptls_buffer_pushv(buf, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE);
        /* date */
        ptls_buffer_push64(buf, ctx->get_time->cb(ctx->get_time));
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off, ticket_nonce)) != 0)
                goto Exit;
            buf->off += sched->hashes[0].algo->digest_size;
        });
        /* key-exchange */
        ptls_buffer_push16(buf, key_exchange_id);
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* server-name */
        ptls_buffer_push_block(buf, 2, {
            if (server_name != NULL)
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
        });
        /* alpn */
        ptls_buffer_push_block(buf, 1, {
            if (negotiated_protocol != NULL)
                ptls_buffer_pushv(buf, negotiated_protocol, strlen(negotiated_protocol));
        });
    });

Exit:
    return ret;
}